

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_pointcloud.cpp
# Opt level: O1

bool __thiscall
ON_PointCloud::GetClosestPoint
          (ON_PointCloud *this,ON_3dPoint P,int *closest_point_index,double maximum_distance)

{
  double dVar1;
  ON_3dPoint P_00;
  bool bVar2;
  
  if (0.0 < maximum_distance) {
    bVar2 = ON_BoundingBox::IsValid(&this->m_bbox);
    if ((bVar2) &&
       (dVar1 = ON_BoundingBox::MinimumDistanceTo(&this->m_bbox,&P), maximum_distance < dVar1)) {
      return false;
    }
  }
  P_00.y = P.y;
  P_00.x = P.x;
  P_00.z = P.z;
  bVar2 = ON_3dPointArray::GetClosestPoint(&this->m_P,P_00,closest_point_index,maximum_distance);
  return bVar2;
}

Assistant:

bool ON_PointCloud::GetClosestPoint(
                ON_3dPoint P,
                int* closest_point_index,
                double maximum_distance 
                ) const
{
  if ( maximum_distance > 0.0 && m_bbox.IsValid() )
  {
    // check bounding box
    if ( m_bbox.MinimumDistanceTo(P) > maximum_distance )
      return false;
  }
  return m_P.GetClosestPoint( P, closest_point_index, maximum_distance );
}